

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_iCCP(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  _func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *p_Var1;
  bool bVar2;
  uint local_44;
  uint string2_begin;
  uint length;
  size_t size;
  uint i;
  uint error;
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGDecompressSettings *zlibsettings_local;
  LodePNGInfo *info_local;
  
  size._4_4_ = 0;
  _string2_begin = 0;
  info->iccp_defined = 1;
  _i = chunkLength;
  chunkLength_local = (size_t)data;
  data_local = (uchar *)zlibsettings;
  zlibsettings_local = (LodePNGDecompressSettings *)info;
  if (info->iccp_name != (char *)0x0) {
    lodepng_clear_icc(info);
  }
  local_44 = 0;
  while( true ) {
    bVar2 = false;
    if (local_44 < _i) {
      bVar2 = *(char *)(chunkLength_local + local_44) != '\0';
    }
    if (!bVar2) break;
    local_44 = local_44 + 1;
  }
  if (local_44 + 2 < _i) {
    if ((local_44 == 0) || (0x4f < local_44)) {
      info_local._4_4_ = 0x59;
    }
    else {
      p_Var1 = (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *
               )lodepng_malloc((ulong)(local_44 + 1));
      zlibsettings_local[7].custom_inflate = p_Var1;
      if (zlibsettings_local[7].custom_inflate ==
          (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0)
      {
        info_local._4_4_ = 0x53;
      }
      else {
        zlibsettings_local[7].custom_inflate[local_44] =
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr)0x0
        ;
        for (size._0_4_ = 0; (uint)size != local_44; size._0_4_ = (uint)size + 1) {
          zlibsettings_local[7].custom_inflate[(uint)size] =
               (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr)
               *(undefined1 *)(chunkLength_local + (uint)size);
        }
        if (*(char *)(chunkLength_local + (local_44 + 1)) == '\0') {
          local_44 = local_44 + 2;
          if (_i < local_44) {
            info_local._4_4_ = 0x4b;
          }
          else {
            size._4_4_ = zlib_decompress((uchar **)&zlibsettings_local[7].custom_context,
                                         (size_t *)&string2_begin,0,
                                         (uchar *)(chunkLength_local + local_44),
                                         (ulong)((int)_i - local_44),
                                         (LodePNGDecompressSettings *)data_local);
            zlibsettings_local[8].ignore_adler32 = (uint)_string2_begin;
            if ((size._4_4_ == 0) && (zlibsettings_local[8].ignore_adler32 == 0)) {
              size._4_4_ = 100;
            }
            info_local._4_4_ = size._4_4_;
          }
        }
        else {
          info_local._4_4_ = 0x48;
        }
      }
    }
  }
  else {
    info_local._4_4_ = 0x4b;
  }
  return info_local._4_4_;
}

Assistant:

static unsigned readChunk_iCCP(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;
  size_t size = 0;

  unsigned length, string2_begin;

  info->iccp_defined = 1;
  if(info->iccp_name) lodepng_clear_icc(info);

  for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
  if(length + 2 >= chunkLength) return 75; /*no null termination, corrupt?*/
  if(length < 1 || length > 79) return 89; /*keyword too short or long*/

  info->iccp_name = (char*)lodepng_malloc(length + 1);
  if(!info->iccp_name) return 83; /*alloc fail*/

  info->iccp_name[length] = 0;
  for(i = 0; i != length; ++i) info->iccp_name[i] = (char)data[i];

  if(data[length + 1] != 0) return 72; /*the 0 byte indicating compression must be 0*/

  string2_begin = length + 2;
  if(string2_begin > chunkLength) return 75; /*no null termination, corrupt?*/

  length = (unsigned)chunkLength - string2_begin;
  error = zlib_decompress(&info->iccp_profile, &size, 0,
                          &data[string2_begin],
                          length, zlibsettings);
  info->iccp_profile_size = size;
  if(!error && !info->iccp_profile_size) error = 100; /*invalid ICC profile size*/
  return error;
}